

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::rc::TextureCube::updateView(TextureCube *this,DepthStencilMode mode)

{
  bool bVar1;
  int iVar2;
  int y;
  ConstPixelBufferAccess *pCVar3;
  Sampler *pSVar4;
  int local_d4;
  TextureCubeView local_c8;
  TextureCubeView local_90;
  int local_58;
  int local_54;
  int face;
  int numLevels;
  bool isMipmap;
  int size;
  ConstPixelBufferAccess *faces [6];
  int baseLevel;
  DepthStencilMode mode_local;
  TextureCube *this_local;
  
  faces[5]._4_4_ = mode;
  faces[5]._0_4_ = Texture::getBaseLevel(&this->super_Texture);
  deMemset(&stack0xffffffffffffffb8,0,0x30);
  bVar1 = isComplete(this);
  if (bVar1) {
    pCVar3 = &getFace(this,(int)faces[5],CUBEFACE_NEGATIVE_X)->super_ConstPixelBufferAccess;
    numLevels = tcu::ConstPixelBufferAccess::getWidth(pCVar3);
    pSVar4 = Texture::getSampler(&this->super_Texture);
    face._3_1_ = isMipmapFilter(pSVar4->minFilter);
    if ((bool)face._3_1_) {
      iVar2 = Texture::getMaxLevel(&this->super_Texture);
      iVar2 = iVar2 - (int)faces[5];
      y = getNumMipLevels1D(numLevels);
      local_d4 = de::min<int>(iVar2 + 1,y);
    }
    else {
      local_d4 = 1;
    }
    local_54 = local_d4;
    for (local_58 = 0; local_58 < 6; local_58 = local_58 + 1) {
      TextureLevelArray::updateSamplerMode(this->m_levels + local_58,faces[5]._4_4_);
      pCVar3 = TextureLevelArray::getEffectiveLevels(this->m_levels + local_58);
      *(ConstPixelBufferAccess **)(&stack0xffffffffffffffb8 + (long)local_58 * 8) =
           pCVar3 + (int)faces[5];
    }
    tcu::TextureCubeView::TextureCubeView
              (&local_90,local_54,(ConstPixelBufferAccess *(*) [6])&stack0xffffffffffffffb8);
    memcpy(&this->m_view,&local_90,0x38);
  }
  else {
    tcu::TextureCubeView::TextureCubeView
              (&local_c8,0,(ConstPixelBufferAccess *(*) [6])&stack0xffffffffffffffb8);
    memcpy(&this->m_view,&local_c8,0x38);
  }
  return;
}

Assistant:

void TextureCube::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int							baseLevel	= getBaseLevel();
	const tcu::ConstPixelBufferAccess*	faces[tcu::CUBEFACE_LAST];

	deMemset(&faces[0], 0, sizeof(faces));

	if (isComplete())
	{
		const int	size		= getFace(baseLevel, tcu::CUBEFACE_NEGATIVE_X).getWidth();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels1D(size)) : 1;

		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			m_levels[face].updateSamplerMode(mode);
			faces[face] = m_levels[face].getEffectiveLevels() + baseLevel;
		}

		m_view = tcu::TextureCubeView(numLevels, faces);
	}
	else
		m_view = tcu::TextureCubeView(0, faces);
}